

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O1

double __thiscall TankMixModel::storedMass(TankMixModel *this)

{
  Segment *pSVar1;
  double dVar2;
  
  pSVar1 = this->firstSeg;
  if (pSVar1 != (Segment *)0x0) {
    dVar2 = 0.0;
    do {
      dVar2 = dVar2 + pSVar1->c * pSVar1->v;
      pSVar1 = pSVar1->next;
    } while (pSVar1 != (Segment *)0x0);
    return dVar2;
  }
  return 0.0;
}

Assistant:

double TankMixModel::storedMass()
{
    double totalMass = 0.0;
    Segment* seg = firstSeg;
    while (seg)
    {
        totalMass += seg->c * seg->v;
        seg = seg->next;
    }
    return totalMass;
}